

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O3

void __thiscall iqxmlrpc::anon_unknown_7::StructBuilder::~StructBuilder(StructBuilder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Value_type *pVVar3;
  
  (this->super_ValueBuilderBase).super_BuilderBase._vptr_BuilderBase =
       (_func_int **)&PTR_do_visit_element_0018ae18;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_ValueBuilderBase).super_BuilderBase._vptr_BuilderBase =
       (_func_int **)&PTR___cxa_pure_virtual_0018a508;
  pVVar3 = (this->super_ValueBuilderBase).retval._M_ptr;
  if (pVVar3 != (Value_type *)0x0) {
    (*pVVar3->_vptr_Value_type[1])();
    return;
  }
  return;
}

Assistant:

StructBuilder(Parser& parser):
    ValueBuilderBase(parser),
    state_(parser, NONE),
    value_(0)
  {
    static const StateMachine::StateTransition trans[] = {
      { NONE, MEMBER, "member" },
      { MEMBER, NAME_READ, "name" },
      { NAME_READ, VALUE_READ, "value" },
      { 0, 0, 0 }
    };
    state_.set_transitions(trans);
    retval.reset(proxy_ = new Struct());
  }